

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::start(QProcess *this,OpenMode mode)

{
  QProcessPrivate *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((this_00->program).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProcessPrivate::start(this_00,mode);
        return;
      }
      goto LAB_003cd8b5;
    }
    tr((QString *)&local_38,"No program defined",(char *)0x0,-1);
    QProcessPrivate::setErrorAndEmit(this_00,FailedToStart,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
  }
  else {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning(&local_38,"QProcess::start: Process is already running");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003cd8b5:
  __stack_chk_fail();
}

Assistant:

void QProcess::start(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (d->program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->start(mode);
}